

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintInt32
          (FastFieldValuePrinter *this,int32_t val,BaseTextGenerator *generator)

{
  AlphaNum *a;
  string local_68;
  AlphaNum local_48;
  
  strings::AlphaNum::AlphaNum(&local_48,val);
  StrCat_abi_cxx11_(&local_68,(protobuf *)&local_48,a);
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintInt32(
    int32_t val, BaseTextGenerator* generator) const {
  generator->PrintString(StrCat(val));
}